

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

bitset_t * bitset_copy(bitset_t *bitset)

{
  size_t sVar1;
  bitset_t *__ptr;
  uint64_t *__dest;
  
  __ptr = (bitset_t *)roaring_malloc(0x18);
  if (__ptr != (bitset_t *)0x0) {
    sVar1 = bitset->arraysize;
    __ptr->array = bitset->array;
    __ptr->arraysize = sVar1;
    __ptr->capacity = bitset->capacity;
    __ptr->capacity = __ptr->arraysize;
    __dest = (uint64_t *)roaring_malloc(bitset->arraysize << 3);
    __ptr->array = __dest;
    if (__dest != (uint64_t *)0x0) {
      memcpy(__dest,bitset->array,bitset->arraysize << 3);
      return __ptr;
    }
    roaring_free(__ptr);
  }
  return (bitset_t *)0x0;
}

Assistant:

bitset_t *bitset_copy(const bitset_t *bitset) {
    bitset_t *copy = NULL;
    /* Allocate the bitset itself. */
    if ((copy = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    memcpy(copy, bitset, sizeof(bitset_t));
    copy->capacity = copy->arraysize;
    if ((copy->array = (uint64_t *)roaring_malloc(sizeof(uint64_t) *
                                                  bitset->arraysize)) == NULL) {
        roaring_free(copy);
        return NULL;
    }
    memcpy(copy->array, bitset->array, sizeof(uint64_t) * bitset->arraysize);
    return copy;
}